

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanObjectWrappers.hpp
# Opt level: O0

VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6> * __thiscall
VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>::
operator=(VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6> *this,
         VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6> *rhs)

{
  VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6> *rhs_local;
  VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6> *this_local;
  
  Release(this);
  std::shared_ptr<const_VulkanUtilities::VulkanLogicalDevice>::operator=
            (&this->m_pLogicalDevice,&rhs->m_pLogicalDevice);
  this->m_VkObject = rhs->m_VkObject;
  rhs->m_VkObject = (VkDeviceMemory_T *)0x0;
  return this;
}

Assistant:

VulkanObjectWrapper& operator=(VulkanObjectWrapper&& rhs) noexcept
    {
        Release();
        m_pLogicalDevice = std::move(rhs.m_pLogicalDevice);
        m_VkObject       = rhs.m_VkObject;
        rhs.m_VkObject   = VK_NULL_HANDLE;
        return *this;
    }